

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLReader::refreshRawBuffer(XMLReader *this)

{
  int iVar1;
  RuntimeException *this_00;
  ulong uVar2;
  undefined4 extraout_var;
  ulong local_30;
  XMLSize_t index;
  XMLSize_t bytesLeft;
  XMLReader *this_local;
  
  if (this->fRawBytesAvail < this->fRawBufIndex) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
               ,0x761,Str_StartIndexPastEnd,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  uVar2 = this->fRawBytesAvail - this->fRawBufIndex;
  for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
    this->fRawByteBuf[local_30] = this->fRawByteBuf[this->fRawBufIndex + local_30];
  }
  iVar1 = (*this->fStream->_vptr_BinInputStream[3])
                    (this->fStream,(long)this + uVar2 + 0x1c048,0xc000 - uVar2);
  this->fRawBytesAvail = CONCAT44(extraout_var,iVar1) + uVar2;
  this->fRawBufIndex = 0;
  return;
}

Assistant:

void XMLReader::refreshRawBuffer()
{
    // Make sure we don't underflow on the subtraction.
    if (fRawBufIndex > fRawBytesAvail) {
        ThrowXMLwithMemMgr1
        (
            RuntimeException
            , XMLExcepts::Str_StartIndexPastEnd
            , fSystemId
            , fMemoryManager
        );
    }

    //
    //  If there are any bytes left, move them down to the start. There
    //  should only ever be (max bytes per char - 1) at the most.
    //
    const XMLSize_t bytesLeft = fRawBytesAvail - fRawBufIndex;

    // Move the existing ones down
    for (XMLSize_t index = 0; index < bytesLeft; index++)
        fRawByteBuf[index] = fRawByteBuf[fRawBufIndex + index];

    //
    //  And then read into the buffer past the existing bytes. Add back in
    //  that many to the bytes read, and subtract that many from the bytes
    //  requested.
    //
    fRawBytesAvail = fStream->readBytes
    (
        &fRawByteBuf[bytesLeft], kRawBufSize - bytesLeft
    ) + bytesLeft;

    //
    //  We need to reset the buffer index back to the start in all cases,
    //  since any trailing data was copied down to the start.
    //
    fRawBufIndex = 0;
}